

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_commit(fdb_file_handle *fhandle,fdb_commit_opt_t opt)

{
  fdb_status fVar1;
  
  if (fhandle != (fdb_file_handle *)0x0) {
    fVar1 = _fdb_commit(fhandle->root,opt,((fhandle->root->config).durability_opt & 2) == 0);
    return fVar1;
  }
  return FDB_RESULT_INVALID_HANDLE;
}

Assistant:

LIBFDB_API
fdb_status fdb_commit(fdb_file_handle *fhandle, fdb_commit_opt_t opt)
{
    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    return _fdb_commit( fhandle->root,
                        opt,
                       !( fhandle->root->config.durability_opt &
                          FDB_DRB_ASYNC ) );
}